

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v6::detail::buffer<char>_>
fmt::v6::detail::
write_padded<(fmt::v6::align::type)2,std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::float_writer<char>>
          (back_insert_iterator<fmt::v6::detail::buffer<char>_> out,basic_format_specs<char> *specs,
          size_t size,size_t width,float_writer<char> *f)

{
  type tVar1;
  checked_ptr<typename_buffer<char>::value_type> it;
  char *pcVar2;
  ulong n;
  ulong uVar3;
  
  tVar1 = to_unsigned<int>(specs->width);
  uVar3 = 0;
  if (width <= tVar1) {
    uVar3 = tVar1 - width;
  }
  n = uVar3 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  it = reserve<fmt::v6::detail::buffer<char>,_0>(out,(specs->fill).size_ * uVar3 + size);
  pcVar2 = fill<char*,char>(it,n,&specs->fill);
  pcVar2 = float_writer<char>::operator()(f,pcVar2);
  fill<char*,char>(pcVar2,uVar3 - n,&specs->fill);
  return (back_insert_iterator<fmt::v6::detail::buffer<char>_>)out.container;
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, const F& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}